

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistence.h
# Opt level: O1

filtration_entry_t __thiscall
priority_queue_t<std::deque<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
::pop_pivot(priority_queue_t<std::deque<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
            *this)

{
  int iVar1;
  uint uVar2;
  pair<float,_int> *ppVar3;
  ulong uVar4;
  _Hash_node_base *p_Var5;
  _Elt_pointer pfVar6;
  __node_base_ptr p_Var7;
  pair<float,_int> pVar8;
  __hash_code __code;
  ulong uVar9;
  uint uVar10;
  _Node_iterator_base<std::pair<const_int,_bool>,_false> _Var11;
  __node_base_ptr p_Var12;
  __node_base_ptr p_Var13;
  pair<float,_int> *ppVar14;
  pair<float,_int> local_38;
  float local_2c;
  
  ppVar14 = &local_38;
  remove_trivial_coefficient_entries(this);
  ppVar3 = &((this->
             super_priority_queue<filtration_entry_t,_std::deque<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
             ).c.super__Deque_base<filtration_entry_t,_std::allocator<filtration_entry_t>_>._M_impl.
             super__Deque_impl_data._M_start._M_cur)->super_pair<float,_int>;
  pVar8 = dummy.super_pair<float,_int>;
  if (&((this->
        super_priority_queue<filtration_entry_t,_std::deque<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
        ).c.super__Deque_base<filtration_entry_t,_std::allocator<filtration_entry_t>_>._M_impl.
        super__Deque_impl_data._M_finish._M_cur)->super_pair<float,_int> != ppVar3) {
    local_38 = *ppVar3;
    if (this->use_dense_version == true) {
      iVar1 = ppVar3->second;
      uVar4 = (this->coefficients)._M_h._M_bucket_count;
      uVar9 = (ulong)(long)iVar1 % uVar4;
      p_Var13 = (this->coefficients)._M_h._M_buckets[uVar9];
      p_Var7 = (__node_base_ptr)0x0;
      if ((p_Var13 != (__node_base_ptr)0x0) &&
         (p_Var5 = p_Var13->_M_nxt, p_Var7 = p_Var13, iVar1 != *(int *)&p_Var13->_M_nxt[1]._M_nxt))
      {
        while (p_Var13 = p_Var5, p_Var5 = p_Var13->_M_nxt, p_Var5 != (_Hash_node_base *)0x0) {
          p_Var7 = (__node_base_ptr)0x0;
          if (((ulong)(long)*(int *)&p_Var5[1]._M_nxt % uVar4 != uVar9) ||
             (p_Var7 = p_Var13, iVar1 == *(int *)&p_Var5[1]._M_nxt)) goto LAB_0013a271;
        }
        p_Var7 = (__node_base_ptr)0x0;
      }
LAB_0013a271:
      if (p_Var7 == (__node_base_ptr)0x0) {
        _Var11._M_cur = (__node_type *)0x0;
      }
      else {
        _Var11._M_cur = (__node_type *)p_Var7->_M_nxt;
      }
      if (_Var11._M_cur != (__node_type *)0x0) {
        std::
        _Hashtable<int,_std::pair<const_int,_bool>,_std::allocator<std::pair<const_int,_bool>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::erase(&(this->coefficients)._M_h,(const_iterator)_Var11._M_cur);
      }
    }
    std::
    priority_queue<filtration_entry_t,_std::deque<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
    ::pop(&this->
           super_priority_queue<filtration_entry_t,_std::deque<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
         );
    local_2c = local_38.first;
    pfVar6 = (this->
             super_priority_queue<filtration_entry_t,_std::deque<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
             ).c.super__Deque_base<filtration_entry_t,_std::allocator<filtration_entry_t>_>._M_impl.
             super__Deque_impl_data._M_start._M_cur;
    if ((this->
        super_priority_queue<filtration_entry_t,_std::deque<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
        ).c.super__Deque_base<filtration_entry_t,_std::allocator<filtration_entry_t>_>._M_impl.
        super__Deque_impl_data._M_finish._M_cur != pfVar6) {
      uVar10 = local_38.second;
      do {
        uVar2 = (pfVar6->super_pair<float,_int>).second;
        ppVar14 = &local_38;
        if (uVar2 != uVar10) break;
        if (this->use_dense_version == true) {
          uVar4 = (this->coefficients)._M_h._M_bucket_count;
          uVar9 = (ulong)(long)(int)uVar2 % uVar4;
          p_Var13 = (this->coefficients)._M_h._M_buckets[uVar9];
          p_Var7 = (__node_base_ptr)0x0;
          if ((p_Var13 != (__node_base_ptr)0x0) &&
             (p_Var7 = p_Var13, p_Var12 = p_Var13->_M_nxt,
             uVar2 != *(uint *)&p_Var13->_M_nxt[1]._M_nxt)) {
            while (p_Var5 = p_Var12->_M_nxt, p_Var5 != (_Hash_node_base *)0x0) {
              p_Var7 = (__node_base_ptr)0x0;
              if (((ulong)(long)(int)*(uint *)&p_Var5[1]._M_nxt % uVar4 != uVar9) ||
                 (p_Var7 = p_Var12, p_Var12 = p_Var5, uVar2 == *(uint *)&p_Var5[1]._M_nxt))
              goto LAB_0013a32c;
            }
            p_Var7 = (__node_base_ptr)0x0;
          }
LAB_0013a32c:
          if (p_Var7 == (__node_base_ptr)0x0) {
            _Var11._M_cur = (__node_type *)0x0;
          }
          else {
            _Var11._M_cur = (__node_type *)p_Var7->_M_nxt;
          }
          if (_Var11._M_cur != (__node_type *)0x0) {
            std::
            _Hashtable<int,_std::pair<const_int,_bool>,_std::allocator<std::pair<const_int,_bool>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::erase(&(this->coefficients)._M_h,(const_iterator)_Var11._M_cur);
          }
        }
        std::
        priority_queue<filtration_entry_t,_std::deque<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
        ::pop(&this->
               super_priority_queue<filtration_entry_t,_std::deque<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
             );
        remove_trivial_coefficient_entries(this);
        pfVar6 = (this->
                 super_priority_queue<filtration_entry_t,_std::deque<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
                 ).c.super__Deque_base<filtration_entry_t,_std::allocator<filtration_entry_t>_>.
                 _M_impl.super__Deque_impl_data._M_start._M_cur;
        if ((this->
            super_priority_queue<filtration_entry_t,_std::deque<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
            ).c.super__Deque_base<filtration_entry_t,_std::allocator<filtration_entry_t>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur == pfVar6) {
          ppVar14 = &dummy.super_pair<float,_int>;
          break;
        }
        local_2c = (pfVar6->super_pair<float,_int>).first;
        uVar10 = (pfVar6->super_pair<float,_int>).second;
        if (this->use_dense_version == true) {
          uVar4 = (this->coefficients)._M_h._M_bucket_count;
          uVar9 = (ulong)(long)(int)uVar10 % uVar4;
          p_Var13 = (this->coefficients)._M_h._M_buckets[uVar9];
          p_Var7 = (__node_base_ptr)0x0;
          if ((p_Var13 != (__node_base_ptr)0x0) &&
             (p_Var7 = p_Var13, p_Var12 = p_Var13->_M_nxt,
             uVar10 != *(uint *)&p_Var13->_M_nxt[1]._M_nxt)) {
            while (p_Var5 = p_Var12->_M_nxt, p_Var5 != (_Hash_node_base *)0x0) {
              p_Var7 = (__node_base_ptr)0x0;
              if (((ulong)(long)(int)*(uint *)&p_Var5[1]._M_nxt % uVar4 != uVar9) ||
                 (p_Var7 = p_Var12, p_Var12 = p_Var5, uVar10 == *(uint *)&p_Var5[1]._M_nxt))
              goto LAB_0013a3d2;
            }
            p_Var7 = (__node_base_ptr)0x0;
          }
LAB_0013a3d2:
          if (p_Var7 == (__node_base_ptr)0x0) {
            _Var11._M_cur = (__node_type *)0x0;
          }
          else {
            _Var11._M_cur = (__node_type *)p_Var7->_M_nxt;
          }
          if (_Var11._M_cur != (__node_type *)0x0) {
            std::
            _Hashtable<int,_std::pair<const_int,_bool>,_std::allocator<std::pair<const_int,_bool>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::erase(&(this->coefficients)._M_h,(const_iterator)_Var11._M_cur);
          }
        }
        std::
        priority_queue<filtration_entry_t,_std::deque<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
        ::pop(&this->
               super_priority_queue<filtration_entry_t,_std::deque<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
             );
        pfVar6 = (this->
                 super_priority_queue<filtration_entry_t,_std::deque<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
                 ).c.super__Deque_base<filtration_entry_t,_std::allocator<filtration_entry_t>_>.
                 _M_impl.super__Deque_impl_data._M_start._M_cur;
        ppVar14 = &local_38;
      } while ((this->
               super_priority_queue<filtration_entry_t,_std::deque<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
               ).c.super__Deque_base<filtration_entry_t,_std::allocator<filtration_entry_t>_>.
               _M_impl.super__Deque_impl_data._M_finish._M_cur != pfVar6);
      local_38 = (pair<float,_int>)((ulong)uVar10 << 0x20);
    }
    local_38.first = local_2c;
    pVar8 = *ppVar14;
  }
  return (filtration_entry_t)pVar8;
}

Assistant:

filtration_entry_t pop_pivot() {
		remove_trivial_coefficient_entries();
		if (std::priority_queue<filtration_entry_t, Container, Comparator>::empty())
			return dummy;
		else {
			auto pivot = get_top();

#ifdef USE_COEFFICIENTS
			coefficient_t coefficient = 0;
			do {
				coefficient = (coefficient + get_coefficient(get_top())) % modulus;
				safe_pop();
				remove_trivial_coefficient_entries();

				if (coefficient == 0) {
					if (std::priority_queue<filtration_entry_t, Container, Comparator>::empty())
						return dummy;
					else
						pivot = get_top();
				}
			} while (!std::priority_queue<filtration_entry_t, Container, Comparator>::empty() &&
			         get_index(get_top()) == get_index(pivot));
			if (get_index(pivot) != -1) { set_coefficient(pivot, coefficient); }
#else
			safe_pop();
			while (!std::priority_queue<filtration_entry_t, Container, Comparator>::empty() &&
			       get_index(std::priority_queue<filtration_entry_t, Container, Comparator>::top()) ==
			           get_index(pivot)) {
				safe_pop();
				remove_trivial_coefficient_entries();

				if (std::priority_queue<filtration_entry_t, Container, Comparator>::empty())
					return dummy;
				else {
					pivot = get_top();
					safe_pop();
				}
			}
#endif
			return pivot;
		}
	}